

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Add(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    *this)

{
  int iVar1;
  Rep *pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (this->super_RepeatedPtrFieldBase).current_size_ = iVar1 + 1;
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pRVar2->elements[iVar1];
    }
  }
  pbVar3 = Arena::Create<std::__cxx11::string>((this->super_RepeatedPtrFieldBase).arena_);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&this->super_RepeatedPtrFieldBase,pbVar3);
  return pbVar3;
}

Assistant:

inline Element* RepeatedPtrField<Element>::Add() {
  return RepeatedPtrFieldBase::Add<TypeHandler>();
}